

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBitvecSet(Bitvec *p,pgno i)

{
  uint uVar1;
  sxu32 sVar2;
  bitvec_rec *pbVar3;
  bitvec_rec *pbVar4;
  bitvec_rec *pbVar5;
  ulong uVar6;
  bitvec_rec *pbVar7;
  bitvec_rec **ppbVar8;
  uint uVar9;
  bool bVar10;
  
  pbVar3 = (bitvec_rec *)SyMemBackendPoolAlloc(p->pAlloc,0x18);
  if (pbVar3 != (bitvec_rec *)0x0) {
    uVar6 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&pbVar3->iPage + uVar6 + 4) = 0;
      uVar6 = uVar6 + 4;
    } while (uVar6 < 0x14);
    pbVar3->iPage = i;
    uVar1 = p->nSize;
    uVar9 = (uint)i & uVar1 - 1;
    ppbVar8 = p->apRec;
    pbVar3->pNextCol = ppbVar8[(int)uVar9];
    ppbVar8[(int)uVar9] = pbVar3;
    pbVar3->pNext = p->pList;
    p->pList = pbVar3;
    uVar9 = p->nRec + 1;
    p->nRec = uVar9;
    bVar10 = uVar9 < uVar1 * 3;
    pbVar3 = (bitvec_rec *)(ulong)CONCAT31((int3)(uVar9 >> 8),99999 < uVar9 || bVar10);
    if (99999 >= uVar9 && !bVar10) {
      pbVar4 = (bitvec_rec *)SyMemBackendAlloc(p->pAlloc,uVar1 << 4);
      pbVar3 = pbVar4;
      if (pbVar4 != (bitvec_rec *)0x0) {
        if ((uVar1 & 0xfffffff) != 0) {
          pbVar5 = (bitvec_rec *)((long)&pbVar4->iPage + (ulong)(uVar1 << 4));
          do {
            *(undefined1 *)&pbVar3->iPage = 0;
            pbVar7 = (bitvec_rec *)((long)&pbVar3->iPage + 1);
            if (pbVar5 <= pbVar7) break;
            *(undefined1 *)&pbVar7->iPage = 0;
            pbVar7 = (bitvec_rec *)((long)&pbVar3->iPage + 2);
            if (pbVar5 <= pbVar7) break;
            *(undefined1 *)&pbVar7->iPage = 0;
            pbVar7 = (bitvec_rec *)((long)&pbVar3->iPage + 3);
            if (pbVar5 <= pbVar7) break;
            *(undefined1 *)&pbVar7->iPage = 0;
            pbVar3 = (bitvec_rec *)((long)&pbVar3->iPage + 4);
          } while (pbVar3 < pbVar5);
        }
        sVar2 = p->nRec;
        if (sVar2 != 0) {
          ppbVar8 = &p->pList;
          do {
            pbVar3 = *ppbVar8;
            pbVar3->pNextCol = (bitvec_rec *)0x0;
            uVar9 = (uint)pbVar3->iPage & uVar1 * 2 - 1;
            pbVar3->pNextCol = (bitvec_rec *)(&pbVar4->iPage)[uVar9];
            (&pbVar4->iPage)[uVar9] = (pgno)pbVar3;
            ppbVar8 = &pbVar3->pNext;
            sVar2 = sVar2 - 1;
          } while (sVar2 != 0);
        }
        uVar9 = SyMemBackendFree(p->pAlloc,p->apRec);
        pbVar3 = (bitvec_rec *)(ulong)uVar9;
        p->apRec = (bitvec_rec **)pbVar4;
        p->nSize = uVar1 * 2;
      }
    }
  }
  return (int)pbVar3;
}

Assistant:

UNQLITE_PRIVATE int unqliteBitvecSet(Bitvec *p,pgno i)
{
	bitvec_rec *pRec;
	sxi32 iBuck;
	/* Allocate a new instance */
	pRec = (bitvec_rec *)SyMemBackendPoolAlloc(p->pAlloc,sizeof(bitvec_rec));
	if( pRec == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRec,sizeof(bitvec_rec));
	/* Fill-in */
	pRec->iPage = i;
	iBuck = i & (p->nSize - 1);
	pRec->pNextCol = p->apRec[iBuck];
	p->apRec[iBuck] = pRec;
	pRec->pNext = p->pList;
	p->pList = pRec;
	p->nRec++;
	if( p->nRec >= (p->nSize * 3) && p->nRec < 100000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = p->nSize << 1;
		bitvec_rec *pEntry,**apNew;
		sxu32 n;
		apNew = (bitvec_rec **)SyMemBackendAlloc(p->pAlloc, nNewSize * sizeof(bitvec_rec *));
		if( apNew ){
			sxu32 iBucket;
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(bitvec_rec *));
			/* Rehash all entries */
			n = 0;
			pEntry = p->pList;
			for(;;){
				/* Loop one */
				if( n >= p->nRec ){
					break;
				}
				pEntry->pNextCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->iPage & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(p->pAlloc,(void *)p->apRec);
			p->apRec = apNew;
			p->nSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}